

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgem.cpp
# Opt level: O0

void test_thin_line_roundtangles(Am_Drawonable *d2)

{
  Am_Drawonable *d2_local;
  
  (**(code **)(*(long *)d2 + 0x168))(d2,&black,&red,0x14,0x14,0xfa,0x118,0x53,0x53,0);
  (**(code **)(*(long *)d2 + 0x168))(d2,&black,&yellow,0x3c,0x3c,0xaa,200,0x2a,0x2a,0);
  (**(code **)(*(long *)d2 + 0x168))(d2,&black,&green,0x5a,0x5a,0x6e,0x8c,0x16,0x16,0);
  (**(code **)(*(long *)d2 + 0xa0))();
  return;
}

Assistant:

void
test_thin_line_roundtangles(Am_Drawonable *d2)
{
  // Large draw-radius (according to formula in Am_DRAW_RADIUS slot)
  d2->Draw_Roundtangle(black, red, 20, 20, 250, 280, 83, 83);
  // Medium draw-radius
  d2->Draw_Roundtangle(black, yellow, 60, 60, 170, 200, 42, 42);
  // Small draw-radius
  d2->Draw_Roundtangle(black, green, 90, 90, 110, 140, 22, 22);

  d2->Flush_Output();
}